

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_hal.cpp
# Opt level: O3

MPP_RET mpp_enc_hal_init(MppEncHal *ctx,MppEncHalCfg *cfg)

{
  undefined8 *puVar1;
  uint uVar2;
  MPP_RET MVar3;
  MppCodingType *ptr;
  void *pvVar4;
  long lVar5;
  
  if (ctx == (MppEncHal *)0x0 || cfg == (MppEncHalCfg *)0x0) {
    _mpp_log_l(2,"mpp_enc_hal","found NULL input ctx %p cfg %p\n","mpp_enc_hal_init",ctx,cfg);
    MVar3 = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (MppEncHal)0x0;
    ptr = (MppCodingType *)mpp_osal_calloc("mpp_enc_hal_init",0x20);
    if (ptr == (MppCodingType *)0x0) {
      _mpp_log_l(2,"mpp_enc_hal","malloc failed\n","mpp_enc_hal_init");
      MVar3 = MPP_ERR_MALLOC;
    }
    else {
      lVar5 = 0;
      do {
        puVar1 = *(undefined8 **)((long)hw_enc_apis + lVar5);
        if (cfg->coding == *(MppCodingType *)(puVar1 + 1)) {
          *ptr = cfg->coding;
          *(undefined8 **)(ptr + 4) = puVar1;
          pvVar4 = mpp_osal_calloc("mpp_enc_hal_init",(ulong)*(uint *)((long)puVar1 + 0xc));
          *(void **)(ptr + 2) = pvVar4;
          uVar2 = (**(code **)(*(undefined8 *)(ptr + 4) + 0x18))(pvVar4,cfg);
          if (uVar2 == 0) {
            MVar3 = hal_task_group_init((HalTaskGroup *)(ptr + 6),3,cfg->task_cnt,0x238);
            if (MVar3 == MPP_OK) {
              cfg->tasks = *(HalTaskGroup *)(ptr + 6);
              *ctx = ptr;
              return MPP_OK;
            }
            _mpp_log_l(2,"mpp_enc_hal","hal_task_group_init failed ret %d\n","mpp_enc_hal_init",
                       (ulong)(uint)MVar3);
          }
          else {
            _mpp_log_l(2,"mpp_enc_hal","hal %s init failed ret %d\n","mpp_enc_hal_init",*puVar1,
                       (ulong)uVar2);
          }
          break;
        }
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x20);
      _mpp_log_l(2,"mpp_enc_hal","could not found coding type %d\n","mpp_enc_hal_init",
                 (ulong)cfg->coding);
      mpp_osal_free("mpp_enc_hal_init",*(void **)(ptr + 2));
      mpp_osal_free("mpp_enc_hal_init",ptr);
      MVar3 = MPP_NOK;
    }
  }
  return MVar3;
}

Assistant:

MPP_RET mpp_enc_hal_init(MppEncHal *ctx, MppEncHalCfg *cfg)
{
    if (NULL == ctx || NULL == cfg) {
        mpp_err_f("found NULL input ctx %p cfg %p\n", ctx, cfg);
        return MPP_ERR_NULL_PTR;
    }
    *ctx = NULL;

    MppEncHalImpl *p = mpp_calloc(MppEncHalImpl, 1);
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_MALLOC;
    }

    RK_U32 i;
    for (i = 0; i < MPP_ARRAY_ELEMS(hw_enc_apis); i++) {
        if (cfg->coding == hw_enc_apis[i]->coding) {
            p->coding       = cfg->coding;
            p->api          = hw_enc_apis[i];
            p->ctx          = mpp_calloc_size(void, p->api->ctx_size);

            MPP_RET ret = p->api->init(p->ctx, cfg);
            if (ret) {
                mpp_err_f("hal %s init failed ret %d\n", hw_enc_apis[i]->name, ret);
                break;
            }

            ret = hal_task_group_init(&p->tasks, TASK_BUTT, cfg->task_cnt,
                                      sizeof(EncAsyncTaskInfo));
            if (ret) {
                mpp_err_f("hal_task_group_init failed ret %d\n", ret);
                break;
            }

            cfg->tasks = p->tasks;
            *ctx = p;
            return MPP_OK;
        }
    }

    mpp_err_f("could not found coding type %d\n", cfg->coding);
    mpp_free(p->ctx);
    mpp_free(p);

    return MPP_NOK;
}